

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void canvas_doaddtemplate(t_symbol *templatesym,int *p_ntemplates,t_symbol ***p_templatevec)

{
  int iVar1;
  t_symbol **pptVar2;
  t_symbol **templatevec;
  int i;
  int n;
  t_symbol ***p_templatevec_local;
  int *p_ntemplates_local;
  t_symbol *templatesym_local;
  
  iVar1 = *p_ntemplates;
  templatevec._0_4_ = 0;
  while( true ) {
    if (iVar1 <= (int)templatevec) {
      pptVar2 = (t_symbol **)resizebytes(*p_templatevec,(long)iVar1 << 3,(long)(iVar1 + 1) << 3);
      pptVar2[iVar1] = templatesym;
      *p_templatevec = pptVar2;
      *p_ntemplates = iVar1 + 1;
      return;
    }
    if ((*p_templatevec)[(int)templatevec] == templatesym) break;
    templatevec._0_4_ = (int)templatevec + 1;
  }
  return;
}

Assistant:

void canvas_doaddtemplate(t_symbol *templatesym,
    int *p_ntemplates, t_symbol ***p_templatevec)
{
    int n = *p_ntemplates, i;
    t_symbol **templatevec = *p_templatevec;
    for (i = 0; i < n; i++)
        if (templatevec[i] == templatesym)
            return;
    templatevec = (t_symbol **)t_resizebytes(templatevec,
        n * sizeof(*templatevec), (n+1) * sizeof(*templatevec));
    templatevec[n] = templatesym;
    *p_templatevec = templatevec;
    *p_ntemplates = n+1;
}